

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::option_syntax_exception::option_syntax_exception
          (option_syntax_exception *this,string *text)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *text_local;
  option_syntax_exception *this_local;
  
  local_18 = text;
  text_local = (string *)this;
  std::operator+(&local_98,"Argument ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::LQUOTE_abi_cxx11_);
  std::operator+(&local_78,&local_98,local_18);
  std::operator+(&local_58,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::RQUOTE_abi_cxx11_);
  std::operator+(&local_38,&local_58," starts with a - but has incorrect syntax");
  OptionParseException::OptionParseException(&this->super_OptionParseException,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  *(undefined ***)&(this->super_OptionParseException).super_OptionException =
       &PTR__option_syntax_exception_0019b218;
  return;
}

Assistant:

option_syntax_exception(const std::string& text)
    : OptionParseException("Argument " + LQUOTE + text + RQUOTE +
        " starts with a - but has incorrect syntax")
    {
    }